

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTest<phmap::priv::ConstructorTest,_testing::internal::TemplateSel<phmap::priv::gtest_suite_ConstructorTest_::AssignmentOnSelf>,_testing::internal::Types<phmap::parallel_node_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_node_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_node_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_00;
  _Alloc_hider type_param;
  bool bVar4;
  int iVar5;
  long *plVar6;
  char *pcVar7;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  long *plVar8;
  size_type *psVar9;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *type;
  long *plVar10;
  ulong uVar11;
  allocator<char> local_1a9;
  long *local_1a8;
  long local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  undefined8 uStack_190;
  int local_184;
  char *local_180;
  char *local_178;
  string local_170;
  long *local_150;
  long local_148;
  long local_140;
  undefined8 uStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  char *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  string local_c0;
  CodeLocation local_a0;
  CodeLocation local_78;
  long *local_50 [2];
  long local_40 [2];
  
  local_178 = case_name;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,prefix,&local_1a9);
  local_180 = prefix;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
  local_130 = &local_120;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_120 = *plVar8;
    lStack_118 = plVar6[3];
  }
  else {
    local_120 = *plVar8;
    local_130 = (long *)*plVar6;
  }
  local_128 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_110 = &local_100;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_100 = *plVar8;
    lStack_f8 = plVar6[3];
  }
  else {
    local_100 = *plVar8;
    local_110 = (long *)*plVar6;
  }
  local_108 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_f0 = &local_e0;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_e0 = *plVar8;
    lStack_d8 = plVar6[3];
  }
  else {
    local_e0 = *plVar8;
    local_f0 = (long *)*plVar6;
  }
  local_e8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,
                              (ulong)(type_names->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[index]._M_dataplus.
                                     _M_p);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_170.field_2._M_allocated_capacity = *psVar9;
    local_170.field_2._8_8_ = plVar6[3];
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar9;
    local_170._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_170._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar7 = strchr(test_names,0x2c);
  if (pcVar7 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,test_names,(allocator<char> *)&local_c0);
    type = extraout_RDX_00;
  }
  else {
    local_1a8 = (long *)&local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,test_names,pcVar7);
    type = extraout_RDX;
  }
  plVar6 = local_1a8;
  local_184 = index;
  local_d0 = test_names;
  local_c8 = type_names;
  if (local_1a0 != 0) {
    pcVar7 = (char *)((long)local_1a8 + local_1a0);
    do {
      plVar8 = local_1a8;
      iVar5 = isspace((uint)(byte)pcVar7[-1]);
      type = extraout_RDX_01;
      plVar6 = plVar8;
      if (iVar5 == 0) break;
      plVar10 = (long *)(pcVar7 + -1);
      uVar11 = (long)plVar10 - (long)plVar8;
      std::__cxx11::string::_M_erase((ulong)&local_1a8,uVar11);
      pcVar7 = (char *)((long)local_1a8 + uVar11);
      type = extraout_RDX_02;
      plVar6 = local_1a8;
    } while (plVar10 != plVar8);
  }
  local_1a8 = (long *)&local_198;
  if (plVar6 == local_1a8) {
    uStack_138 = uStack_190;
    plVar6 = &local_140;
  }
  local_140 = CONCAT71(uStack_197,local_198);
  local_148 = local_1a0;
  local_1a0 = 0;
  local_198 = 0;
  local_150 = plVar6;
  GetTypeName_abi_cxx11_
            (&local_c0,
             (internal *)
             &phmap::
              parallel_node_hash_map<phmap::priv::hash_internal::Enum,std::__cxx11::string,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>,4ul,phmap::NullMutex>
              ::typeinfo,type);
  type_param._M_p = local_c0._M_dataplus._M_p;
  paVar1 = &local_78.file.field_2;
  pcVar3 = (code_location->file)._M_dataplus._M_p;
  local_78.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (code_location->file)._M_string_length);
  local_78.line = code_location->line;
  set_up_tc = SuiteApiResolver<phmap::priv::gtest_suite_ConstructorTest_::AssignmentOnSelf<phmap::parallel_node_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>_>_>
              ::GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,local_78.line);
  tear_down_tc = SuiteApiResolver<phmap::priv::gtest_suite_ConstructorTest_::AssignmentOnSelf<phmap::parallel_node_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_phmap::NullMutex>_>_>
                 ::GetTearDownCaseOrSuite
                           ((code_location->file)._M_dataplus._M_p,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0033d8b0;
  MakeAndRegisterTestInfo
            (&local_170,(char *)plVar6,type_param._M_p,(char *)0x0,&local_78,
             &TypeIdHelper<phmap::priv::ConstructorTest<phmap::parallel_node_hash_map<phmap::priv::hash_internal::Enum,std::__cxx11::string,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>,4ul,phmap::NullMutex>>>
              ::dummy_,set_up_tc,tear_down_tc,factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.file._M_dataplus._M_p,local_78.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_1a8 != (long *)&local_198) {
    operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  type_names_00 = local_c8;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  paVar2 = &local_a0.file.field_2;
  local_a0.file._M_dataplus._M_p = (code_location->file)._M_dataplus._M_p;
  paVar1 = &(code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.file._M_dataplus._M_p == paVar1) {
    local_a0.file.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a0.file.field_2._8_8_ = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    local_a0.file._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a0.file.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_a0.file._M_string_length = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar1;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_a0.line = code_location->line;
  bVar4 = TypeParameterizedTest<phmap::priv::ConstructorTest,_testing::internal::TemplateSel<phmap::priv::gtest_suite_ConstructorTest_::AssignmentOnSelf>,_testing::internal::Types<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_node_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_node_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>_>
          ::Register(local_180,&local_a0,local_178,local_d0,local_184 + 1,type_names_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.file._M_dataplus._M_p,local_a0.file.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)]),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>::
        Register(prefix, std::move(code_location), case_name, test_names,
                 index + 1, type_names);
  }